

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_vector_unittest.cpp
# Opt level: O3

void __thiscall HostVector_constructor_Test::TestBody(HostVector_constructor_Test *this)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  long lVar7;
  void *__ptr;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  AssertionResult gtest_ar;
  void *ptr;
  Message local_78;
  AssertHelper local_70;
  ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_68;
  void *local_50;
  void *local_48;
  ulong local_40;
  
  iVar6 = posix_memalign(&local_50,8,400);
  lVar7 = 0;
  __ptr = (void *)0x0;
  if (iVar6 == 0) {
    __ptr = local_50;
  }
  uVar10 = 0;
  uVar11 = 1;
  uVar12 = 2;
  uVar13 = 3;
  do {
    pfVar1 = (float *)((long)__ptr + lVar7 * 4);
    *pfVar1 = ((float)(uVar10 >> 0x10 | 0x53000000) - 5.497642e+11) +
              (float)(uVar10 & 0xffff | 0x4b000000);
    pfVar1[1] = ((float)(uVar11 >> 0x10 | 0x53000000) - 5.497642e+11) +
                (float)(uVar11 & 0xffff | 0x4b000000);
    pfVar1[2] = ((float)(uVar12 >> 0x10 | 0x53000000) - 5.497642e+11) +
                (float)(uVar12 & 0xffff | 0x4b000000);
    pfVar1[3] = ((float)(uVar13 >> 0x10 | 0x53000000) - 5.497642e+11) +
                (float)(uVar13 & 0xffff | 0x4b000000);
    lVar7 = lVar7 + 4;
    uVar10 = uVar10 + 4;
    uVar11 = uVar11 + 4;
    uVar12 = uVar12 + 4;
    uVar13 = uVar13 + 4;
  } while (lVar7 != 100);
  local_68.
  super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
  .pointer_ = (pointer)((long)__ptr + 0x168);
  local_68.
  super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
  .size_ = 10;
  memory::
  Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>
  ::
  Array<memory::ArrayReference<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>,void>
            ((Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>
              *)&local_50,&local_68);
  auVar4 = _DAT_0014c360;
  auVar3 = _DAT_0014bb30;
  auVar2 = _DAT_0014bb20;
  lVar7 = 0;
  do {
    auVar14._8_4_ = (int)lVar7;
    auVar14._0_8_ = lVar7;
    auVar14._12_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar15 = (auVar14 | auVar2) ^ auVar3;
    if (auVar15._4_4_ == -0x80000000 && auVar15._0_4_ < -0x7ffffff6) {
      *(undefined4 *)((long)__ptr + lVar7 * 4 + 0x168) = 0xbf800000;
      *(undefined4 *)((long)__ptr + lVar7 * 4 + 0x16c) = 0xbf800000;
    }
    auVar14 = (auVar14 | auVar4) ^ auVar3;
    if (auVar14._4_4_ == -0x80000000 && auVar14._0_4_ < -0x7ffffff6) {
      *(undefined4 *)((long)__ptr + lVar7 * 4 + 0x170) = 0xbf800000;
      *(undefined4 *)((long)__ptr + lVar7 * 4 + 0x174) = 0xbf800000;
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  lVar7 = 0;
  uVar9 = 0;
  do {
    local_78.ss_.ptr_._0_4_ = (float)((int)uVar9 + 0x5a);
    if (local_40 <= uVar9) {
      __assert_fail("i<size_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/include/ArrayView.hpp"
                    ,0x186,
                    "reference memory::ArrayViewImpl<memory::ArrayReference<float, memory::HostCoordinator<float>>, float, memory::HostCoordinator<float>>::operator[](size_type) [R = memory::ArrayReference<float, memory::HostCoordinator<float>>, T = float, Coord = memory::HostCoordinator<float>]"
                   );
    }
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&local_68,"float(i+90)","v3[i]",(float *)&local_78,
               (float *)((long)local_48 + lVar7));
    if ((internal)
        local_68.
        super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
        ._0_1_ == (internal)0x0) {
      testing::Message::Message(&local_78);
      pcVar8 = "";
      if (local_68.
          super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
          .pointer_ != (pointer)0x0) {
        pcVar8 = *(char **)local_68.
                           super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
                           .pointer_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
                 ,0x28,pcVar8);
      testing::internal::AssertHelper::operator=(&local_70,&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (((CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) &&
          (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
         ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_68.
              super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
              .pointer_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar9 = uVar9 + 1;
    lVar7 = lVar7 + 4;
  } while (uVar9 != 10);
  lVar7 = 0x168;
  do {
    local_78.ss_.ptr_._0_4_ = -1.0;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&local_68,"float(-1)","v1[i]",(float *)&local_78,
               (float *)((long)__ptr + lVar7));
    if ((internal)
        local_68.
        super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
        ._0_1_ == (internal)0x0) {
      testing::Message::Message(&local_78);
      pcVar8 = "";
      if (local_68.
          super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
          .pointer_ != (pointer)0x0) {
        pcVar8 = *(char **)local_68.
                           super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
                           .pointer_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
                 ,0x2b,pcVar8);
      testing::internal::AssertHelper::operator=(&local_70,&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (((CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) &&
          (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
         ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_68.
              super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
              .pointer_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar7 = lVar7 + 4;
  } while (lVar7 != 400);
  if (local_48 != (void *)0x0) {
    free(local_48);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

TEST(HostVector, constructor) {
    using namespace memory;

    // default constructor
    HostVector<float> v2;

    // length constructor
    HostVector<float> v1(100);

    // initialize values as monotone sequence
    for(int i=0; i<v1.size(); ++i)
        v1[i] = float(i);

    // initialize new HostVector from a subrange
    HostVector<float> v3(v1(90, 100));

    // reset values in range
    for(auto &v : v1(90, 100))
        v = float(-1.0);

    // check that v3 has values originally copied over from v1
    for(int i=0; i<10; i++)
        EXPECT_EQ(float(i+90), v3[i]);

    for(int i=90; i<100; i++)
        EXPECT_EQ(float(-1), v1[i]);
}